

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  char cVar1;
  iterator iVar2;
  iterator iVar3;
  bool bVar4;
  cmState *this_00;
  cmCommand *pcVar5;
  cmTarget *pcVar6;
  ostream *poVar7;
  cmTest *pcVar8;
  char *pcVar9;
  PolicyID id;
  cmConditionEvaluator *pcVar10;
  cmMakefile *pcVar11;
  _Self __tmp;
  _List_node_base *p_Var12;
  cmExpandedCommandArgument *pcVar13;
  string *name;
  int reducible;
  iterator local_1e8;
  iterator arg;
  iterator local_1d8;
  string local_1d0;
  _List_node_base *local_1b0;
  PolicyID pid;
  
  do {
    reducible = 0;
    p_Var12 = (newArgs->
              super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    while( true ) {
      if (p_Var12 == (_List_node_base *)newArgs) break;
      local_1e8._M_node =
           (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
            &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      local_1d8._M_node = local_1e8._M_node;
      if (local_1e8._M_node != (_List_node_base *)newArgs) {
        local_1d8._M_node = (local_1e8._M_node)->_M_next;
      }
      arg._M_node = p_Var12;
      std::__cxx11::string::string((string *)&pid,"EXISTS",(allocator *)&local_1d0);
      pcVar13 = (cmExpandedCommandArgument *)(p_Var12 + 1);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar10 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar4 = cmsys::SystemTools::FileExists((char *)pcVar10);
          HandlePredicate(pcVar10,bVar4,&reducible,&arg,newArgs,&local_1e8,&local_1d8);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"IS_DIRECTORY",(allocator *)&local_1d0);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string
                    ((string *)&pid,(char *)iVar2._M_node[1]._M_next,(allocator *)&local_1d0);
          pcVar11 = (cmMakefile *)&pid;
          bVar4 = cmsys::SystemTools::FileIsDirectory((string *)&pid);
          HandlePredicate((cmConditionEvaluator *)pcVar11,bVar4,&reducible,&arg,newArgs,&local_1e8,
                          &local_1d8);
          goto LAB_003b90d8;
        }
      }
      else {
LAB_003b90d8:
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"IS_SYMLINK",(allocator *)&local_1d0);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          std::__cxx11::string::string
                    ((string *)&pid,(char *)iVar2._M_node[1]._M_next,(allocator *)&local_1d0);
          pcVar11 = (cmMakefile *)&pid;
          bVar4 = cmsys::SystemTools::FileIsSymlink((string *)&pid);
          HandlePredicate((cmConditionEvaluator *)pcVar11,bVar4,&reducible,&arg,newArgs,&local_1e8,
                          &local_1d8);
          goto LAB_003b9150;
        }
      }
      else {
LAB_003b9150:
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"IS_ABSOLUTE",(allocator *)&local_1d0);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar10 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar4 = cmsys::SystemTools::FileIsFullPath((char *)pcVar10);
          HandlePredicate(pcVar10,bVar4,&reducible,&arg,newArgs,&local_1e8,&local_1d8);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"COMMAND",(allocator *)&local_1d0);
      iVar3 = arg;
      pcVar13 = (cmExpandedCommandArgument *)(arg._M_node + 1);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      local_1b0 = iVar3._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          this_00 = cmMakefile::GetState(this->Makefile);
          std::__cxx11::string::string
                    ((string *)&pid,(char *)iVar2._M_node[1]._M_next,(allocator *)&local_1d0);
          pcVar5 = cmState::GetCommand(this_00,(string *)&pid);
          pcVar11 = (cmMakefile *)&pid;
          std::__cxx11::string::~string((string *)&pid);
          HandlePredicate((cmConditionEvaluator *)pcVar11,pcVar5 != (cmCommand *)0x0,&reducible,&arg
                          ,newArgs,&local_1e8,&local_1d8);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"POLICY",(allocator *)&local_1d0);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar10 = (cmConditionEvaluator *)iVar2._M_node[1]._M_next;
          bVar4 = cmPolicies::GetPolicyID((char *)pcVar10,&pid);
          HandlePredicate(pcVar10,bVar4,&reducible,&arg,newArgs,&local_1e8,&local_1d8);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      std::__cxx11::string::string((string *)&pid,"TARGET",(allocator *)&local_1d0);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          pcVar11 = this->Makefile;
          pcVar6 = cmMakefile::FindTargetToUse(pcVar11,(string *)(iVar2._M_node + 1),false);
          HandlePredicate((cmConditionEvaluator *)pcVar11,pcVar6 != (cmTarget *)0x0,&reducible,&arg,
                          newArgs,&local_1e8,&local_1d8);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      if (this->Policy64Status < NEW) {
        if (this->Policy64Status == WARN) {
          std::__cxx11::string::string((string *)&pid,"TEST",(allocator *)&local_1d0);
          bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
          std::__cxx11::string::~string((string *)&pid);
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&pid);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0x40,id);
            poVar7 = std::operator<<((ostream *)&pid,(string *)&local_1d0);
            std::operator<<(poVar7,"\n");
            std::__cxx11::string::~string((string *)&local_1d0);
            std::operator<<((ostream *)&pid,
                            "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                           );
            pcVar11 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar11,AUTHOR_WARNING,&local_1d0,false);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pid);
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)&pid,"TEST",(allocator *)&local_1d0);
        bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
        iVar2._M_node = local_1e8._M_node;
        if (bVar4) {
          std::__cxx11::string::~string((string *)&pid);
          if (iVar2._M_node != (_List_node_base *)newArgs) {
            pcVar11 = this->Makefile;
            std::__cxx11::string::string
                      ((string *)&pid,(char *)iVar2._M_node[1]._M_next,(allocator *)&local_1d0);
            pcVar8 = cmMakefile::GetTest(pcVar11,(string *)&pid);
            pcVar11 = (cmMakefile *)&pid;
            std::__cxx11::string::~string((string *)&pid);
            HandlePredicate((cmConditionEvaluator *)pcVar11,pcVar8 != (cmTest *)0x0,&reducible,&arg,
                            newArgs,&local_1e8,&local_1d8);
          }
        }
        else {
          std::__cxx11::string::~string((string *)&pid);
        }
      }
      std::__cxx11::string::string((string *)&pid,"DEFINED",(allocator *)&local_1d0);
      bVar4 = IsKeyword(this,(string *)&pid,pcVar13);
      iVar2._M_node = local_1e8._M_node;
      if (bVar4) {
        std::__cxx11::string::~string((string *)&pid);
        if (iVar2._M_node != (_List_node_base *)newArgs) {
          p_Var12 = iVar2._M_node[1]._M_prev;
          name = (string *)(iVar2._M_node + 1);
          if (p_Var12 < (_List_node_base *)0x5) {
LAB_003b9591:
            pcVar11 = this->Makefile;
            bVar4 = cmMakefile::IsDefinitionSet(pcVar11,name);
          }
          else {
            std::__cxx11::string::substr((ulong)&pid,(ulong)name);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&pid,"ENV{");
            if (!bVar4) {
              std::__cxx11::string::~string((string *)&pid);
              goto LAB_003b9591;
            }
            cVar1 = ((name->_M_dataplus)._M_p + -1)[(long)p_Var12];
            std::__cxx11::string::~string((string *)&pid);
            if (cVar1 != '}') goto LAB_003b9591;
            std::__cxx11::string::substr((ulong)&pid,(ulong)name);
            pcVar9 = cmsys::SystemTools::GetEnv(_pid);
            bVar4 = pcVar9 != (char *)0x0;
            pcVar11 = (cmMakefile *)&pid;
            std::__cxx11::string::~string((string *)&pid);
          }
          HandlePredicate((cmConditionEvaluator *)pcVar11,bVar4,&reducible,&arg,newArgs,&local_1e8,
                          &local_1d8);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&pid);
      }
      p_Var12 = local_1b0->_M_next;
    }
    if (reducible == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList &newArgs,
                  std::string &, cmake::MessageType &)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      // does a file exist
      if (this->IsKeyword("EXISTS", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileExists(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a directory with this name exist
      if (this->IsKeyword("IS_DIRECTORY", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsDirectory(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a symlink with this name exist
      if (this->IsKeyword("IS_SYMLINK", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsSymlink(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // is the given path an absolute path ?
      if (this->IsKeyword("IS_ABSOLUTE", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsFullPath(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a command exist
      if (this->IsKeyword("COMMAND", *arg) && argP1 != newArgs.end())
        {
        cmCommand* command =
            this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(
          command ? true : false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a policy exist
      if (this->IsKeyword("POLICY", *arg) && argP1 != newArgs.end())
        {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(
          cmPolicies::GetPolicyID(argP1->c_str(), pid),
            reducible, arg, newArgs, argP1, argP2);
        }
      // does a target exist
      if (this->IsKeyword("TARGET", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue())?true:false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a test exist
      if(this->Policy64Status != cmPolicies::OLD &&
        this->Policy64Status != cmPolicies::WARN)
        {
        if (this->IsKeyword("TEST", *arg) && argP1 != newArgs.end())
          {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(
            haveTest?true:false,
            reducible, arg, newArgs, argP1, argP2);
          }
        }
      else if(this->Policy64Status == cmPolicies::WARN &&
        this->IsKeyword("TEST", *arg))
        {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
          "when the policy is set to NEW.  "
          "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      // is a variable defined
      if (this->IsKeyword("DEFINED", *arg) && argP1 != newArgs.end())
        {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if(argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
           argP1->GetValue().operator[](argP1len-1) == '}')
          {
          std::string env = argP1->GetValue().substr(4, argP1len-5);
          bdef = cmSystemTools::GetEnv(env.c_str())?true:false;
          }
        else
          {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
          }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}